

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool check_pattern(pattern *ptrn)

{
  bool local_26;
  uint local_24;
  tok_tp *ptStack_20;
  uint tok_idx;
  tok_tp *cur_tok;
  pattern *ptrn_local;
  
  ptStack_20 = ptrn->toks;
  local_24 = 0;
  while( true ) {
    if (*ptStack_20 == SH4ASM_TOK_NEWLINE || n_tokens <= local_24) {
      local_26 = *ptStack_20 == SH4ASM_TOK_NEWLINE && local_24 == n_tokens;
      return local_26;
    }
    if (*ptStack_20 != tokens[local_24].tp) break;
    ptStack_20 = ptStack_20 + 1;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

static bool check_pattern(struct pattern const *ptrn) {
    enum tok_tp const *cur_tok = ptrn->toks;
    unsigned tok_idx = 0;

    while (*cur_tok != SH4ASM_TOK_NEWLINE && tok_idx < n_tokens) {
        if (*cur_tok != tokens[tok_idx].tp)
            return false;

        cur_tok++;
        tok_idx++;
    }

    return (*cur_tok == SH4ASM_TOK_NEWLINE) && (tok_idx == n_tokens);
}